

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-flate.c
# Opt level: O0

hd_stream * hd_open_flated(hd_context *ctx,hd_stream *chain,int window_bits)

{
  int *piVar1;
  int iVar2;
  hd_stream *phVar3;
  int local_2c;
  undefined8 *puStack_28;
  int code;
  hd_flate *state;
  hd_stream *phStack_18;
  int window_bits_local;
  hd_stream *chain_local;
  hd_context *ctx_local;
  
  puStack_28 = (undefined8 *)0x0;
  local_2c = 0;
  state._4_4_ = window_bits;
  phStack_18 = chain;
  chain_local = (hd_stream *)ctx;
  hd_var_imp(&local_2c);
  hd_var_imp(&stack0xffffffffffffffd8);
  iVar2 = hd_push_try((hd_context *)chain_local);
  if ((iVar2 != 0) && (iVar2 = __sigsetjmp(**(long **)&chain_local->avail + 8,0), iVar2 == 0)) {
    puStack_28 = (undefined8 *)hd_calloc((hd_context *)chain_local,1,0x1078);
    *puStack_28 = phStack_18;
    puStack_28[9] = zalloc_flate;
    puStack_28[10] = zfree_flate;
    puStack_28[0xb] = chain_local;
    puStack_28[1] = 0;
    *(undefined4 *)(puStack_28 + 2) = 0;
    local_2c = inflateInit2_(puStack_28 + 1,state._4_4_,"1.2.11",0x70);
    if (local_2c != 0) {
      hd_throw((hd_context *)chain_local,2,"zlib error: inflateInit: %s",puStack_28[7]);
    }
    local_2c = 0;
  }
  piVar1 = (int *)**(undefined8 **)&chain_local->avail;
  **(undefined8 **)&chain_local->avail = piVar1 + -0x34;
  if (*piVar1 < 2) {
    phVar3 = hd_new_stream((hd_context *)chain_local,puStack_28,next_flated,close_flated);
    return phVar3;
  }
  if ((puStack_28 != (undefined8 *)0x0) && (local_2c == 0)) {
    inflateEnd(puStack_28 + 1);
  }
  hd_free((hd_context *)chain_local,puStack_28);
  hd_drop_stream((hd_context *)chain_local,phStack_18);
  hd_rethrow((hd_context *)chain_local);
}

Assistant:

hd_stream *
hd_open_flated(hd_context *ctx, hd_stream *chain, int window_bits)
{
    hd_flate *state = NULL;
    int code = Z_OK;

    hd_var(code);
    hd_var(state);

    hd_try(ctx)
    {
        state = hd_malloc_struct(ctx, hd_flate);
        state->chain = chain;

        state->z.zalloc = zalloc_flate;
        state->z.zfree = zfree_flate;
        state->z.opaque = ctx;
        state->z.next_in = NULL;
        state->z.avail_in = 0;

        code = inflateInit2(&state->z, window_bits);
        if (code != Z_OK)
            hd_throw(ctx, HD_ERROR_GENERIC, "zlib error: inflateInit: %s", state->z.msg);
    }
    hd_catch(ctx)
    {
        if (state && code == Z_OK)
            inflateEnd(&state->z);
        hd_free(ctx, state);
        hd_drop_stream(ctx, chain);
        hd_rethrow(ctx);
    }
    return hd_new_stream(ctx, state, next_flated, close_flated);
}